

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDFace::RotateEdgeArray(ON_SubDFace *this,uint fei0)

{
  uint uVar1;
  ON_SubDEdgePtr **local_90;
  uint local_80;
  uint local_7c;
  uint fei_1;
  uint fei;
  ON_SubDEdgePtr *feptr;
  ON_SubDEdgePtr *eptr;
  ON_SubDEdgePtr stack_eptr [8];
  uint edge_count;
  uint fei0_local;
  ON_SubDFace *this_local;
  
  if (fei0 == 0) {
    this_local._7_1_ = true;
  }
  else {
    uVar1 = (uint)this->m_edge_count;
    if (((uVar1 < 2) || (0xfff0 < uVar1)) || (uVar1 <= fei0)) {
      this_local._7_1_ = false;
    }
    else {
      if ((ulong)uVar1 << 3 < 0x41) {
        local_90 = &eptr;
      }
      else {
        local_90 = (ON_SubDEdgePtr **)onmalloc((ulong)uVar1 << 3);
      }
      if (local_90 == (ON_SubDEdgePtr **)0x0) {
        this_local._7_1_ = false;
      }
      else {
        _fei_1 = this->m_edge4;
        for (local_7c = 0; local_7c < uVar1; local_7c = local_7c + 1) {
          if ((local_7c == 4) && (_fei_1 = this->m_edgex, _fei_1 == (ON_SubDEdgePtr *)0x0)) {
            if (local_90 != &eptr) {
              onfree(local_90);
            }
            return false;
          }
          local_90[local_7c] = (ON_SubDEdgePtr *)_fei_1->m_ptr;
          _fei_1 = _fei_1 + 1;
        }
        _fei_1 = this->m_edge4;
        for (local_80 = 0; local_80 < uVar1; local_80 = local_80 + 1) {
          if (local_80 == 4) {
            _fei_1 = this->m_edgex;
          }
          _fei_1->m_ptr = (ON__UINT_PTR)local_90[(ulong)(local_80 + fei0) % (ulong)uVar1];
          _fei_1 = _fei_1 + 1;
        }
        if (local_90 != &eptr) {
          onfree(local_90);
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDFace::RotateEdgeArray(
  unsigned int fei0
)
{
  if (0 == fei0)
    return true;

  const unsigned int edge_count = m_edge_count;
  if (edge_count < 2 || edge_count > ON_SubDFace::MaximumEdgeCount || fei0 >= edge_count)
    return false;

  ON_SubDEdgePtr stack_eptr[8];
  ON_SubDEdgePtr* eptr 
    = (edge_count*sizeof(stack_eptr[0]) > sizeof(stack_eptr)) 
    ? ((ON_SubDEdgePtr*)onmalloc(edge_count * sizeof(eptr[0])))
    : stack_eptr;
  if (nullptr == eptr)
    return false;

  ON_SubDEdgePtr* feptr = m_edge4;
  for (unsigned int fei = 0; fei < edge_count; fei++)
  {
    if (4 == fei)
    {
      feptr = m_edgex;
      if (nullptr == feptr)
      {
        if ( eptr != stack_eptr )
          onfree(eptr);  
        return false;
      }
    }
    eptr[fei] = *feptr++;
  }

  feptr = m_edge4;
  for (unsigned int fei = 0; fei < edge_count; fei++)
  {
    if (4 == fei)
      feptr = m_edgex;
    *feptr++ = eptr[(fei + fei0) % edge_count];
  }
  if ( eptr != stack_eptr )
    onfree(eptr);

  return true;
}